

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factor.h
# Opt level: O2

factor * __thiscall
merlin::factor::maxmarginal(factor *__return_storage_ptr__,factor *this,variable_set *target)

{
  double dVar1;
  pointer pdVar2;
  pointer pdVar3;
  size_t i;
  ulong uVar4;
  double dVar5;
  subindex s;
  subindex local_60;
  
  variable_set::operator&((variable_set *)&local_60,target,&this->v_);
  factor(__return_storage_ptr__,(variable_set *)&local_60,-INFINITY);
  variable_set::~variable_set((variable_set *)&local_60);
  subindex::subindex(&local_60,&this->v_,&__return_storage_ptr__->v_);
  for (uVar4 = 0;
      pdVar2 = (this->t_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar4 < (ulong)((long)(this->t_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)pdVar2 >> 3);
      uVar4 = uVar4 + 1) {
    pdVar3 = (__return_storage_ptr__->t_).super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    dVar5 = pdVar3[local_60.m_idx];
    dVar1 = pdVar2[uVar4];
    if (dVar5 <= dVar1) {
      dVar5 = dVar1;
    }
    pdVar3[local_60.m_idx] = dVar5;
    subindex::operator++(&local_60);
  }
  subindex::~subindex(&local_60);
  return __return_storage_ptr__;
}

Assistant:

factor maxmarginal(variable_set const& target) const {
		factor F(target & vars(), -infty());
		subindex s(v_, F.vars());
		for (size_t i = 0; i < num_states(); ++i, ++s)
			F[s] = (F[s] > t_[i]) ? F[s] : t_[i];
		return F;
	}